

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void AddAttrToList(AttVal **list,AttVal *av)

{
  AttVal *pAVar1;
  AttVal *pAVar2;
  
  pAVar1 = *list;
  while (pAVar2 = pAVar1, pAVar2 != (AttVal *)0x0) {
    pAVar1 = pAVar2->next;
    list = &pAVar2->next;
  }
  ((AttVal *)list)->next = av;
  return;
}

Assistant:

static void AddAttrToList( AttVal** list, AttVal* av )
{
  if ( *list == NULL )
    *list = av;
  else
  {
    AttVal* here = *list;
    while ( here->next )
      here = here->next;
    here->next = av;
  }
}